

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O0

void __thiscall
absl::lts_20250127::base_internal::AtomicHook<void_(*)(long)>::Store
          (AtomicHook<void_(*)(long)> *this,FnPtr fn)

{
  bool bVar1;
  bool success;
  FnPtr fn_local;
  AtomicHook<void_(*)(long)> *this_local;
  
  bVar1 = DoStore(this,fn);
  if (bVar1) {
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/atomic_hook.h"
                ,0x6e,
                "void absl::base_internal::AtomicHook<void (*)(long)>::Store(FnPtr) [T = void (*)(long)]"
               );
}

Assistant:

void Store(FnPtr fn) {
    bool success = DoStore(fn);
    static_cast<void>(success);
    assert(success);
  }